

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghprll(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,
            long *pcount,long *gcount,int *extend,int *status)

{
  int *in_stack_00000020;
  double ddummy;
  LONGLONG lldummy;
  int idummy;
  LONGLONG *in_stack_000001d0;
  int *in_stack_000001d8;
  int *in_stack_000001e0;
  int *in_stack_000001e8;
  int in_stack_000001f4;
  fitsfile *in_stack_000001f8;
  long *in_stack_00000210;
  long *in_stack_00000218;
  int *in_stack_00000220;
  double *in_stack_00000228;
  double *in_stack_00000230;
  LONGLONG *in_stack_00000238;
  int *in_stack_00000240;
  int *in_stack_00000248;
  
  ffgphd(in_stack_000001f8,in_stack_000001f4,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
         in_stack_000001d0,in_stack_00000210,in_stack_00000218,in_stack_00000220,in_stack_00000228,
         in_stack_00000230,in_stack_00000238,in_stack_00000240,in_stack_00000248);
  return *in_stack_00000020;
}

Assistant:

int ffghprll(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the PRimary array:
  Check that the keywords conform to the FITS standard and return the
  parameters which determine the size and structure of the primary array
  or IMAGE extension.
*/
{
    int idummy;
    LONGLONG lldummy;
    double ddummy;

    ffgphd(fptr, maxdim, simple, bitpix, naxis, naxes, pcount, gcount, extend,
          &ddummy, &ddummy, &lldummy, &idummy, status);

    return(*status);
}